

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGenericHandler.cxx
# Opt level: O2

void __thiscall cmCTestGenericHandler::cmCTestGenericHandler(cmCTestGenericHandler *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_cmCTestGenericHandler = (_func_int **)&PTR_PopulateCustomVectors_00639fa0;
  p_Var1 = &(this->Options)._M_t._M_impl.super__Rb_tree_header;
  (this->Options)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Options)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Options)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Options)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->PersistentOptions)._M_t._M_impl.super__Rb_tree_header;
  (this->PersistentOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PersistentOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->PersistentOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->PersistentOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->PersistentOptions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->HandlerVerbose = OUTPUT_NONE;
  this->CTest = (cmCTest *)0x0;
  this->SubmitIndex = 0;
  this->AppendXML = false;
  this->Quiet = false;
  this->TestLoad = 0;
  return;
}

Assistant:

cmCTestGenericHandler::cmCTestGenericHandler()
{
  this->HandlerVerbose = cmSystemTools::OUTPUT_NONE;
  this->CTest = nullptr;
  this->SubmitIndex = 0;
  this->AppendXML = false;
  this->Quiet = false;
  this->TestLoad = 0;
}